

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

ValidateXrFlagsResult ValidateXrFrameSynthesisInfoFlagsEXT(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 4) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrFrameSynthesisInfoFlagsEXT(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_FRAME_SYNTHESIS_INFO_USE_2D_MOTION_VECTOR_BIT_EXT) != 0) {
        // Clear the value XR_FRAME_SYNTHESIS_INFO_USE_2D_MOTION_VECTOR_BIT_EXT since it is valid
        int_value &= ~XR_FRAME_SYNTHESIS_INFO_USE_2D_MOTION_VECTOR_BIT_EXT;
    }
    if ((int_value & XR_FRAME_SYNTHESIS_INFO_REQUEST_RELAXED_FRAME_INTERVAL_BIT_EXT) != 0) {
        // Clear the value XR_FRAME_SYNTHESIS_INFO_REQUEST_RELAXED_FRAME_INTERVAL_BIT_EXT since it is valid
        int_value &= ~XR_FRAME_SYNTHESIS_INFO_REQUEST_RELAXED_FRAME_INTERVAL_BIT_EXT;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}